

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void bluntify(void)

{
  _Hash_node_base *p_Var1;
  Node *pNVar2;
  bool bVar3;
  char *pcVar4;
  _Hash_node_base *p_Var5;
  Edges *pEVar6;
  _Hash_node_base *p_Var7;
  long lVar8;
  iterator iVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  size_t __bkt;
  ulong uVar12;
  __hash_code __code;
  Edges *pEVar13;
  Node *this;
  int iVar14;
  Node *this_00;
  _Hash_node_base *p_Var15;
  __node_base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  int iVar18;
  __hash_code __code_2;
  long lVar19;
  EdgesIterator EVar20;
  __hash_code __code_1;
  Edges left_edges;
  Edges right_edges;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  good_edges;
  undefined4 in_stack_ffffffffffffff04;
  Edges *this_01;
  Edges local_e8;
  pair<long,_long> local_d0;
  EdgesIterator local_c0;
  _Hash_node_base *local_b0;
  Edges *local_a8;
  Node *local_a0;
  EdgesIterator local_98;
  EdgesIterator local_88;
  Edges local_78;
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  local_60;
  
  Logger::debug(logger,"bluntifying graph");
  if (0 < Node::last_id) {
    p_Var5 = (_Hash_node_base *)0x1;
    do {
      uVar12 = (ulong)p_Var5 % Node::nodes._M_h._M_bucket_count;
      p_Var11 = Node::nodes._M_h._M_buckets[uVar12];
      p_Var10 = (__node_base_ptr)0x0;
      if ((p_Var11 != (__node_base_ptr)0x0) &&
         (p_Var10 = p_Var11, p_Var16 = p_Var11->_M_nxt, p_Var5 != p_Var11->_M_nxt[1]._M_nxt)) {
        while (p_Var17 = p_Var16->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
          p_Var10 = (__node_base_ptr)0x0;
          if (((ulong)p_Var17[1]._M_nxt % Node::nodes._M_h._M_bucket_count != uVar12) ||
             (p_Var10 = p_Var16, p_Var16 = p_Var17, p_Var5 == p_Var17[1]._M_nxt)) goto LAB_00103105;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
LAB_00103105:
      if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
        if (p_Var11 == (__node_base_ptr)0x0) {
LAB_00103152:
          p_Var15 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var17 = p_Var11->_M_nxt[1]._M_nxt;
          p_Var7 = p_Var11->_M_nxt;
          do {
            p_Var15 = p_Var11;
            if (p_Var5 == p_Var17) break;
            p_Var1 = p_Var7->_M_nxt;
            if (p_Var1 == (_Hash_node_base *)0x0) goto LAB_00103152;
            p_Var17 = p_Var1[1]._M_nxt;
            p_Var15 = (_Hash_node_base *)0x0;
            p_Var11 = p_Var7;
            p_Var7 = p_Var1;
          } while ((ulong)p_Var17 % Node::nodes._M_h._M_bucket_count == uVar12);
        }
        if (p_Var15 == (_Hash_node_base *)0x0) {
          p_Var17 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var17 = p_Var15->_M_nxt;
        }
        bVar3 = Edges::empty((Edges *)(p_Var17 + 4));
        iVar18 = 0;
        if (!bVar3) {
          iVar18 = (k - (k + -1 >> 0x1f)) + -1 >> 1;
        }
        bVar3 = Edges::empty((Edges *)(p_Var17 + 7));
        iVar14 = *(int *)&p_Var17[3]._M_nxt;
        if (!bVar3) {
          iVar14 = iVar14 - k / 2;
        }
        pcVar4 = Node::get_sequence((Node *)(p_Var17 + 2));
        Node::set_sequence((Node *)(p_Var17 + 2),pcVar4 + iVar18,iVar14 - iVar18);
      }
      bVar3 = (long)p_Var5 < Node::last_id;
      p_Var5 = (_Hash_node_base *)((long)&p_Var5->_M_nxt + 1);
    } while (bVar3);
  }
  if ((k & 1U) == 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < Node::last_id) {
      local_b0 = (_Hash_node_base *)Node::last_id;
      p_Var5 = (_Hash_node_base *)0x1;
      p_Var17 = (_Hash_node_base *)Node::last_id;
      do {
        uVar12 = (ulong)p_Var5 % Node::nodes._M_h._M_bucket_count;
        p_Var11 = Node::nodes._M_h._M_buckets[uVar12];
        p_Var10 = (__node_base_ptr)0x0;
        if ((p_Var11 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var11, p_Var16 = p_Var11->_M_nxt, p_Var5 != p_Var11->_M_nxt[1]._M_nxt)) {
          while (p_Var7 = p_Var16->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
            p_Var10 = (__node_base_ptr)0x0;
            if (((ulong)p_Var7[1]._M_nxt % Node::nodes._M_h._M_bucket_count != uVar12) ||
               (p_Var10 = p_Var16, p_Var16 = p_Var7, p_Var5 == p_Var7[1]._M_nxt)) goto LAB_0010328b;
          }
          p_Var10 = (__node_base_ptr)0x0;
        }
LAB_0010328b:
        if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
          if (p_Var11 == (__node_base_ptr)0x0) {
LAB_001032dd:
            p_Var15 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var17 = p_Var11->_M_nxt[1]._M_nxt;
            p_Var7 = p_Var11->_M_nxt;
            do {
              p_Var15 = p_Var11;
              if (p_Var5 == p_Var17) break;
              p_Var1 = p_Var7->_M_nxt;
              if (p_Var1 == (_Hash_node_base *)0x0) goto LAB_001032dd;
              p_Var17 = p_Var1[1]._M_nxt;
              p_Var15 = (_Hash_node_base *)0x0;
              p_Var11 = p_Var7;
              p_Var7 = p_Var1;
            } while ((ulong)p_Var17 % Node::nodes._M_h._M_bucket_count == uVar12);
          }
          if (p_Var15 == (_Hash_node_base *)0x0) {
            p_Var17 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var17 = p_Var15->_M_nxt;
          }
          this_01 = (Edges *)(p_Var17 + 7);
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_78.neighbour_ids,(vector<long,_std::allocator<long>_> *)this_01);
          EVar20 = Edges::begin(&local_78);
          local_e8.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)EVar20.edges;
          local_e8.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = EVar20.index;
          EVar20 = Edges::end(&local_78);
          pEVar6 = EVar20.edges;
          this_00 = (Node *)(p_Var17 + 2);
          iVar18 = EVar20.index;
          lVar8 = 0;
          while (bVar3 = Edges::EdgesIterator::operator!=
                                   ((EdgesIterator *)&local_e8,
                                    (EdgesIterator *)&stack0xfffffffffffffef8), bVar3) {
            p_Var7 = (_Hash_node_base *)Edges::EdgesIterator::operator*((EdgesIterator *)&local_e8);
            if (0 < (long)p_Var7) {
              if (lVar8 == 0) {
                Node::get_sequence(this_00);
                lVar8 = Node::add_node((char *)this_01,0,CONCAT44(in_stack_ffffffffffffff04,iVar18),
                                       (long)pEVar6);
                Node::add_edge(this_00->id,'+',lVar8,'+');
              }
              Edges::erase(this_01,(long)p_Var7);
              p_Var11 = Node::nodes._M_h._M_buckets
                        [(ulong)p_Var7 % Node::nodes._M_h._M_bucket_count];
              for (p_Var10 = Node::nodes._M_h._M_buckets
                             [(ulong)p_Var7 % Node::nodes._M_h._M_bucket_count]->_M_nxt;
                  p_Var7 != p_Var10[1]._M_nxt; p_Var10 = p_Var10->_M_nxt) {
                p_Var11 = p_Var10;
              }
              Edges::erase((Edges *)(p_Var11->_M_nxt + 7),this_00->id);
              Node::add_edge(lVar8,'+',(long)p_Var7,'-');
            }
            Edges::EdgesIterator::operator++((EdgesIterator *)&local_e8);
          }
          local_a8 = (Edges *)(p_Var17 + 4);
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_e8.neighbour_ids,(vector<long,_std::allocator<long>_> *)local_a8);
          EVar20 = Edges::begin(&local_e8);
          pEVar6 = EVar20.edges;
          iVar18 = EVar20.index;
          EVar20 = Edges::end(&local_e8);
          local_88.edges = EVar20.edges;
          local_88.index = EVar20.index;
          local_a0 = this_00;
          while (bVar3 = Edges::EdgesIterator::operator!=
                                   ((EdgesIterator *)&stack0xfffffffffffffef8,&local_88), bVar3) {
            lVar8 = Edges::EdgesIterator::operator*((EdgesIterator *)&stack0xfffffffffffffef8);
            if (lVar8 < 0) {
              pEVar13 = (Edges *)-lVar8;
              local_c0._8_8_ = this_00->id;
              local_c0.edges = pEVar13;
              iVar9 = std::
                      _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      ::find(&local_60,(key_type *)&local_c0);
              if ((_Rb_tree_header *)iVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
                p_Var11 = Node::nodes._M_h._M_buckets
                          [(ulong)pEVar13 % Node::nodes._M_h._M_bucket_count];
                p_Var10 = (__node_base_ptr)0x0;
                if ((p_Var11 != (__node_base_ptr)0x0) &&
                   (p_Var10 = p_Var11, p_Var16 = p_Var11->_M_nxt,
                   (Edges *)p_Var11->_M_nxt[1]._M_nxt != pEVar13)) {
                  while (p_Var7 = p_Var16->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                    p_Var10 = (__node_base_ptr)0x0;
                    if (((ulong)p_Var7[1]._M_nxt % Node::nodes._M_h._M_bucket_count !=
                         (ulong)pEVar13 % Node::nodes._M_h._M_bucket_count) ||
                       (p_Var10 = p_Var16, p_Var16 = p_Var7, (Edges *)p_Var7[1]._M_nxt == pEVar13))
                    goto LAB_0010351e;
                  }
                  p_Var10 = (__node_base_ptr)0x0;
                }
LAB_0010351e:
                if (p_Var10 == (__node_base_ptr)0x0) {
                  p_Var7 = (_Hash_node_base *)0x0;
                }
                else {
                  p_Var7 = p_Var10->_M_nxt;
                }
                Edges::erase(local_a8,lVar8);
                Edges::erase((Edges *)(p_Var7 + 4),-this_00->id);
                lVar19 = 1;
                lVar8 = 1;
                if (*(int *)&p_Var7[3]._M_nxt < 2) {
                  lVar8 = Edges::size((Edges *)(p_Var7 + 7));
                }
                if (*(int *)&p_Var17[3]._M_nxt < 2) {
                  lVar19 = Edges::size(this_01);
                }
                if ((lVar8 != 0) && (lVar19 != 0)) {
                  this = (Node *)(p_Var7 + 2);
                  pNVar2 = this_00;
                  if (lVar19 <= lVar8) {
                    this = this_00;
                    pNVar2 = (Node *)(p_Var7 + 2);
                  }
                  if (1 < this->sequence_len) {
                    Node::get_sequence(this);
                    p_Var7 = (_Hash_node_base *)
                             Node::add_node((char *)this_01,0,
                                            CONCAT44(in_stack_ffffffffffffff04,iVar18),(long)pEVar6)
                    ;
                    this->sequence_len = 1;
                    p_Var11 = Node::nodes._M_h._M_buckets
                              [(ulong)p_Var7 % Node::nodes._M_h._M_bucket_count];
                    for (p_Var10 = Node::nodes._M_h._M_buckets
                                   [(ulong)p_Var7 % Node::nodes._M_h._M_bucket_count]->_M_nxt;
                        p_Var7 != p_Var10[1]._M_nxt; p_Var10 = p_Var10->_M_nxt) {
                      p_Var11 = p_Var10;
                    }
                    Node::move_right_edges_to(this,(Node *)(p_Var11->_M_nxt + 2),true);
                    Node::add_edge(this->id,'+',(long)p_Var7,'+');
                  }
                  EVar20 = Edges::begin(&this->right_edges);
                  local_c0.edges = EVar20.edges;
                  local_c0.index = EVar20.index;
                  EVar20 = Edges::end(&this->right_edges);
                  local_98.edges = EVar20.edges;
                  local_98.index = EVar20.index;
                  while (bVar3 = Edges::EdgesIterator::operator!=(&local_c0,&local_98), bVar3) {
                    lVar8 = Edges::EdgesIterator::operator*(&local_c0);
                    if (lVar8 < 0) {
                      lVar8 = -lVar8;
                      Node::add_edge(lVar8,'-',pNVar2->id,'+');
                      local_d0.second = pNVar2->id;
                      local_d0.first = lVar8;
                      std::
                      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                      ::_M_emplace_unique<std::pair<long,long>>
                                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                  *)&local_60,&local_d0);
                      local_d0.first = pNVar2->id;
                      local_d0.second = lVar8;
                      std::
                      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                      ::_M_emplace_unique<std::pair<long,long>>
                                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                  *)&local_60,&local_d0);
                      this_00 = local_a0;
                    }
                    else {
                      Node::add_edge(lVar8,'+',pNVar2->id,'+');
                    }
                    Edges::EdgesIterator::operator++(&local_c0);
                  }
                }
              }
            }
            Edges::EdgesIterator::operator++((EdgesIterator *)&stack0xfffffffffffffef8);
          }
          if ((Edges *)local_e8.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start != (Edges *)0x0) {
            operator_delete(local_e8.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var17 = local_b0;
          if (local_78.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            p_Var17 = local_b0;
          }
        }
        bVar3 = p_Var5 != p_Var17;
        p_Var5 = (_Hash_node_base *)((long)&p_Var5->_M_nxt + 1);
      } while (bVar3);
    }
    std::
    _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void bluntify() {
    logger->debug("bluntifying graph");
    for (long i = 1; i <= Node::last_id; ++i) {
        if (Node::nodes.find(i) == Node::nodes.end())
            continue;
        Node &node = Node::nodes.find(i)->second;
        int from, to;
        if (!node.left_edges.empty())
            from = (k - 1) / 2;
        else
            from = 0;
        if (!node.right_edges.empty())
            to = node.sequence_len - k / 2;
        else
            to = node.sequence_len;
        node.set_sequence(node.get_sequence() + from, to - from);
    }
    if (k % 2 == 0) {
        set<pair<long, long>> good_edges;
        long node_last_id = Node::last_id;
        for (long i = 1; i <= node_last_id; ++i) {
            if (Node::nodes.find(i) == Node::nodes.end())
                continue;
            Node &node = Node::nodes.find(i)->second;
            long new_right_node_id = 0;
            auto right_edges = node.right_edges;
            for (long right_neighbour_id : right_edges) {
                if (right_neighbour_id > 0) {
                    if (new_right_node_id == 0) {
                        new_right_node_id = Node::add_node(node.get_sequence() + node.sequence_len, 1);
                        Node::add_edge(node.id, '+', new_right_node_id, '+');
                    }
                    node.right_edges.erase(right_neighbour_id);
                    Node::nodes.find(right_neighbour_id)->second.right_edges.erase(node.id);
                    Node::add_edge(new_right_node_id, '+', right_neighbour_id, '-');
                }
            }
            auto left_edges = node.left_edges;
            for (long left_neighbour_id : left_edges)
                if (left_neighbour_id < 0 &&
                    good_edges.find(pair<long, long>(-1 * left_neighbour_id, node.id)) == good_edges.end()) {
                    Node &left_neighbour = Node::nodes.find(-1 * left_neighbour_id)->second;
                    node.left_edges.erase(left_neighbour_id);
                    left_neighbour.left_edges.erase(node.id * -1);
                    long left_neighbour_right_edge_size =
                            left_neighbour.sequence_len > 1 ? 1 : left_neighbour.right_edges.size();
                    long node_right_edge_size = node.sequence_len > 1 ? 1 : node.right_edges.size();
                    if (left_neighbour_right_edge_size == 0 || node_right_edge_size == 0)
                        continue;
                    Node *from_node, *to_node;
                    if (left_neighbour_right_edge_size < node_right_edge_size) {
                        from_node = &left_neighbour;
                        to_node = &node;
                    } else {
                        from_node = &node;
                        to_node = &left_neighbour;
                    }
                    if (from_node->sequence_len > 1) {
                        long expanded_node_id = Node::add_node(from_node->get_sequence() + 1,
                                                               from_node->sequence_len - 1);
                        from_node->sequence_len = 1;
                        from_node->move_right_edges_to(Node::nodes.find(expanded_node_id)->second);
                        Node::add_edge(from_node->id, '+', expanded_node_id, '+');
                    }
                    for (long right_neighbour_id : from_node->right_edges)
                        if (right_neighbour_id < 0) {
                            Node::add_edge(-1 * right_neighbour_id, '-', to_node->id, '+');
                            good_edges.emplace(pair<long, long>(-1 * right_neighbour_id, to_node->id));
                            good_edges.emplace(pair<long, long>(to_node->id, -1 * right_neighbour_id));
                        } else
                            Node::add_edge(right_neighbour_id, '+', to_node->id, '+');
                }
        }
    }
}